

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

Am_Connection * Am_Connection::Open(char *addr)

{
  sockaddr *sa_00;
  hostent *phVar1;
  Am_Connection *local_28;
  Am_Connection *p_connection;
  sockaddr_in *sa;
  hostent *hp;
  char *addr_local;
  
  sa_00 = (sockaddr *)operator_new(0x10);
  phVar1 = gethostbyname(addr);
  if (phVar1 == (hostent *)0x0) {
    local_28 = Open();
  }
  else {
    memmove(sa_00->sa_data + 2,*phVar1->h_addr_list,(long)phVar1->h_length);
    sa_00->sa_family = 2;
    sa_00->sa_data[0] = -0x58;
    sa_00->sa_data[1] = '\x16';
    local_28 = Open(sa_00);
  }
  return local_28;
}

Assistant:

Am_Connection *
Am_Connection::Open(const char addr[])
{
  /*
   * Variable initialization
   */
  struct hostent *hp;     /* result of host name lookup */
  struct sockaddr_in *sa; /* Internet socket addr. structure */
  Am_Connection *p_connection;
  sa = new (struct sockaddr_in);

  /* Look up the specified hostname */
  if ((hp = gethostbyname(addr)) == nullptr) {
    p_connection = Open();
  } else {
    /* Put host's address and address type into socket structure */
    memmove(&(sa->sin_addr), hp->h_addr, hp->h_length);
    sa->sin_family = PF_INET;
    /* Put the port into the socket structure */
    sa->sin_port = Am_SOCKET_PORT;
    p_connection = Open((struct sockaddr *)sa);
  }
  return p_connection;
}